

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<float,1,0>::accumulateDerivativesImpl<true,true,true>
          (BeagleCPUImpl<float,1,0> *this,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  uVar1 = *(uint *)(this + 0x14);
  lVar2 = *(long *)(this + 0xf8);
  lVar3 = *(long *)(this + 0xf0);
  lVar4 = *(long *)(this + 0x78);
  auVar7 = ZEXT816(0) << 0x40;
  auVar9 = ZEXT816(0) << 0x40;
  uVar5 = 0;
  while( true ) {
    if ((~((int)uVar1 >> 0x1f) & uVar1) == uVar5) break;
    auVar8._0_8_ = (double)auVar9._0_4_;
    auVar8._8_8_ = auVar9._8_8_;
    fVar10 = *(float *)(lVar2 + uVar5 * 4) / *(float *)(lVar3 + uVar5 * 4);
    auVar12._0_8_ = (double)fVar10;
    auVar12._8_8_ = 0;
    outDerivatives[uVar5] = auVar12._0_8_;
    auVar11._0_8_ = (double)(fVar10 * fVar10);
    auVar11._8_8_ = 0;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = *(ulong *)(lVar4 + uVar5 * 8);
    uVar5 = uVar5 + 1;
    auVar6 = vfmadd231sd_fma(auVar8,auVar13,auVar12);
    auVar9._0_4_ = (float)auVar6._0_8_;
    auVar9._4_12_ = auVar6._4_12_;
    auVar6._0_8_ = (double)auVar7._0_4_;
    auVar6._8_8_ = auVar7._8_8_;
    auVar6 = vfmadd231sd_fma(auVar6,auVar13,auVar11);
    auVar7._0_4_ = (float)auVar6._0_8_;
    auVar7._4_12_ = auVar6._4_12_;
  }
  *outSumDerivatives = (double)auVar9._0_4_;
  *outSumSquaredDerivatives = (double)auVar7._0_4_;
  return;
}

Assistant:

void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateDerivativesImpl(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    REALTYPE sum = 0.0;
    REALTYPE sumSquared = 0.0;

    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE derivative = grandNumeratorDerivTmp[k] / grandDenominatorDerivTmp[k];
        if (DoDerivatives) {
            outDerivatives[k] = derivative;
        }
        if (DoSum) { // TODO Confirm that these are compile-time
            sum += derivative * gPatternWeights[k];
        }
        if (DoSumSquared) {
            sumSquared += derivative * derivative * gPatternWeights[k];
        }
    }

    if (DoSum) {
        *outSumDerivatives = sum;
    }

    if (DoSumSquared) {
        *outSumSquaredDerivatives = sumSquared;
    }
}